

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_remove_output(wally_psbt *psbt,uint32_t index)

{
  wally_tx *tx;
  int iVar1;
  undefined1 free_parent;
  ulong uVar2;
  
  free_parent = (undefined1)index;
  iVar1 = -2;
  if (((psbt != (wally_psbt *)0x0) && (tx = psbt->tx, tx != (wally_tx *)0x0)) &&
     (tx->num_outputs == psbt->num_outputs)) {
    uVar2 = (ulong)index;
    iVar1 = wally_tx_remove_output(tx,uVar2);
    free_parent = (undefined1)uVar2;
  }
  if (iVar1 == 0) {
    uVar2 = (ulong)index;
    psbt_output_free(psbt->outputs + uVar2,(_Bool)free_parent);
    memmove(psbt->outputs + uVar2,psbt->outputs + uVar2 + 1,(~uVar2 + psbt->num_outputs) * 0xd0);
    psbt->num_outputs = psbt->num_outputs - 1;
  }
  return iVar1;
}

Assistant:

int wally_psbt_remove_output(struct wally_psbt *psbt, uint32_t index)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_outputs != psbt->num_outputs)
        ret = WALLY_EINVAL;
    else
        ret = wally_tx_remove_output(psbt->tx, index);
    if (ret == WALLY_OK) {
        psbt_output_free(&psbt->outputs[index], false);
        memmove(psbt->outputs + index, psbt->outputs + index + 1,
                (psbt->num_outputs - index - 1) * sizeof(struct wally_psbt_output));
        psbt->num_outputs -= 1;
    }
    return ret;
}